

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week5-app3.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<float> __l;
  anon_class_1_0_00000001 square;
  allocator<float> local_4d;
  float local_4c [3];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<float,_std::allocator<float>_> v;
  char **argv_local;
  int argc_local;
  
  local_4c[0] = 10.1;
  local_4c[1] = 20.2;
  local_4c[2] = 30.3;
  local_40 = local_4c;
  local_38 = 3;
  v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)argv;
  std::allocator<float>::allocator(&local_4d);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_30,__l,&local_4d);
  std::allocator<float>::~allocator(&local_4d);
  print<std::vector<float,std::allocator<float>>>((vector<float,_std::allocator<float>_> *)local_30)
  ;
  transform<std::vector<float,std::allocator<float>>,Increment<float>>
            ((vector<float,_std::allocator<float>_> *)local_30,(Increment<float>)0x40600000);
  print<std::vector<float,std::allocator<float>>>((vector<float,_std::allocator<float>_> *)local_30)
  ;
  transform<std::vector<float,std::allocator<float>>,main::__0>(local_30);
  print<std::vector<float,std::allocator<float>>>((vector<float,_std::allocator<float>_> *)local_30)
  ;
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_30);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
//    auto increment_by5 = Increment{5};
//    auto increment_by10 = Increment{10};
////    increment.operator()();
//    auto i = 100;
//    for(int k=0; k<3; ++k)
//        increment_by5(i);
//    cout << i << endl;

    auto v = vector<float>{10.1, 20.2, 30.3};
    print(v);

//    by_what = 3;
    transform(v, Increment<float>{3.5f});
    print(v);

//    transform(v, Square{});
    auto square = [](auto& item) { item = item*item; };
    transform(v, square);
    print(v);

    return 0;
}